

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void testGetElementById(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ElementData *pEVar3;
  mapped_type *pmVar4;
  string source;
  Node result;
  Node node;
  stringstream buffer;
  ifstream file;
  string local_500;
  string local_4e0;
  Node local_4c0;
  Node local_438;
  stringstream local_3b0 [16];
  ostream local_3a0 [112];
  ios_base local_330 [264];
  undefined1 local_228 [16];
  streambuf local_218 [504];
  
  std::ifstream::ifstream(local_228,"source/parseTest.html",_S_in);
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::ostream::operator<<(local_3a0,local_218);
  std::__cxx11::stringbuf::str();
  crawler::parse(&local_438,&local_4e0);
  paVar1 = &local_500.field_2;
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"main","");
  crawler::Node::getElementById(&local_4c0,&local_438,&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  printNode(&local_4c0);
  test_count = test_count + 1;
  pEVar3 = crawler::Node::getElementData(&local_4c0);
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"class","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&pEVar3->attributes,&local_500);
  iVar2 = strcmp((pmVar4->_M_dataplus)._M_p,"test");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar3 = crawler::Node::getElementData(&local_4c0);
    local_500._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"class","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(&pEVar3->attributes,&local_500);
    testGetElementById();
  }
  if (local_4c0.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4c0.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_4c0.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_4c0.children);
  if (local_438.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_438.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_438.children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::ios_base::~ios_base(local_330);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void testGetElementById() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Node result = node.getElementById("main");
  printNode(result);
  ASSERT_CSTRING_EQ(result.getElementData().getAttributes().at("class").c_str(),
                    "test");
}